

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

BranchInstr * __thiscall IR::Instr::ChangeCmCCToBranchInstr(Instr *this,LabelInstr *targetInstr)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  OpCode opcode;
  uint32 offset;
  undefined4 *puVar5;
  BranchInstr *instr;
  Opnd *pOVar6;
  
  switch(this->m_opcode) {
  case CmUnGe_A:
    opcode = BrUnGe_A;
    break;
  case CmUnGt_A:
    opcode = BrUnGt_A;
    break;
  case CmUnLt_A:
    opcode = BrUnLt_A;
    break;
  case CmUnLe_A:
    opcode = BrUnLe_A;
    break;
  case CmEq_I4:
    opcode = BrEq_I4;
    break;
  case CmNeq_I4:
    opcode = BrNeq_I4;
    break;
  case CmLt_I4:
    opcode = BrLt_I4;
    break;
  case CmLe_I4:
    opcode = BrLe_I4;
    break;
  case CmGt_I4:
    opcode = BrGt_I4;
    break;
  case CmGe_I4:
    opcode = BrGe_I4;
    break;
  case CmUnLt_I4:
    opcode = BrUnLt_I4;
    break;
  case CmUnLe_I4:
    opcode = BrUnLe_I4;
    break;
  case CmUnGt_I4:
    opcode = BrUnGt_I4;
    break;
  case CmUnGe_I4:
    opcode = BrUnGe_I4;
    break;
  default:
    switch(this->m_opcode) {
    case CmEq_A:
      opcode = BrEq_A;
      break;
    case CmGe_A:
      opcode = BrGe_A;
      break;
    case CmGt_A:
      opcode = BrGt_A;
      break;
    case CmLt_A:
      opcode = BrLt_A;
      break;
    case CmLe_A:
      opcode = BrLe_A;
      break;
    case CmNeq_A:
      opcode = BrNeq_A;
      break;
    case CmSrEq_A:
      opcode = BrSrEq_A;
      break;
    case CmSrNeq_A:
      opcode = BrSrNeq_A;
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xf50,"((0))","UNREACHED");
      if (!bVar3) goto LAB_004c340c;
      *puVar5 = 0;
      opcode = InvalidOpCode;
    }
  }
  instr = BranchInstr::New(opcode,targetInstr,this->m_func);
  InsertBefore(this,&instr->super_Instr);
  offset = GetByteCodeOffset(this);
  SetByteCodeOffset(&instr->super_Instr,offset);
  pOVar6 = UnlinkSrc1(this);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_004c340c;
    *puVar5 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if (pOVar6->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_004c340c;
    *puVar5 = 0;
  }
  bVar4 = pOVar6->field_0xb;
  if ((bVar4 & 2) != 0) {
    pOVar6 = Opnd::Copy(pOVar6,pFVar1);
    bVar4 = pOVar6->field_0xb;
  }
  pOVar6->field_0xb = bVar4 | 2;
  (instr->super_Instr).m_src1 = pOVar6;
  pOVar6 = UnlinkSrc2(this);
  if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_004c340c;
    *puVar5 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if (pOVar6->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_004c340c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = pOVar6->field_0xb;
  if ((bVar4 & 2) != 0) {
    pOVar6 = Opnd::Copy(pOVar6,pFVar1);
    bVar4 = pOVar6->field_0xb;
  }
  pOVar6->field_0xb = bVar4 | 2;
  (instr->super_Instr).m_src2 = pOVar6;
  Unlink(this);
  Free(this);
  return instr;
}

Assistant:

BranchInstr *
Instr::ChangeCmCCToBranchInstr(LabelInstr *targetInstr)
{
    Js::OpCode newOpcode = Js::OpCode::InvalidOpCode;
    switch (this->m_opcode)
    {
    case Js::OpCode::CmEq_A:
        newOpcode = Js::OpCode::BrEq_A;
        break;
    case Js::OpCode::CmGe_A:
        newOpcode = Js::OpCode::BrGe_A;
        break;
    case Js::OpCode::CmGt_A:
        newOpcode = Js::OpCode::BrGt_A;
        break;
    case Js::OpCode::CmLt_A:
        newOpcode = Js::OpCode::BrLt_A;
        break;
    case Js::OpCode::CmLe_A:
        newOpcode = Js::OpCode::BrLe_A;
        break;
    case Js::OpCode::CmUnGe_A:
        newOpcode = Js::OpCode::BrUnGe_A;
        break;
    case Js::OpCode::CmUnGt_A:
        newOpcode = Js::OpCode::BrUnGt_A;
        break;
    case Js::OpCode::CmUnLt_A:
        newOpcode = Js::OpCode::BrUnLt_A;
        break;
    case Js::OpCode::CmUnLe_A:
        newOpcode = Js::OpCode::BrUnLe_A;
        break;
    case Js::OpCode::CmNeq_A:
        newOpcode = Js::OpCode::BrNeq_A;
        break;
    case Js::OpCode::CmSrEq_A:
        newOpcode = Js::OpCode::BrSrEq_A;
        break;
    case Js::OpCode::CmSrNeq_A:
        newOpcode = Js::OpCode::BrSrNeq_A;
        break;
    case Js::OpCode::CmEq_I4:
        newOpcode = Js::OpCode::BrEq_I4;
        break;
    case Js::OpCode::CmGe_I4:
        newOpcode = Js::OpCode::BrGe_I4;
        break;
    case Js::OpCode::CmGt_I4:
        newOpcode = Js::OpCode::BrGt_I4;
        break;
    case Js::OpCode::CmLt_I4:
        newOpcode = Js::OpCode::BrLt_I4;
        break;
    case Js::OpCode::CmLe_I4:
        newOpcode = Js::OpCode::BrLe_I4;
        break;
    case Js::OpCode::CmUnGe_I4:
        newOpcode = Js::OpCode::BrUnGe_I4;
        break;
    case Js::OpCode::CmUnGt_I4:
        newOpcode = Js::OpCode::BrUnGt_I4;
        break;
    case Js::OpCode::CmUnLt_I4:
        newOpcode = Js::OpCode::BrUnLt_I4;
        break;
    case Js::OpCode::CmUnLe_I4:
        newOpcode = Js::OpCode::BrUnLe_I4;
        break;
    case Js::OpCode::CmNeq_I4:
        newOpcode = Js::OpCode::BrNeq_I4;
        break;
    default:
        Assert(UNREACHED);
        __assume(UNREACHED);
    }

    BranchInstr *instrBr = BranchInstr::New(newOpcode, targetInstr, this->m_func);
    this->InsertBefore(instrBr);
    instrBr->SetByteCodeOffset(this);
    instrBr->SetSrc1(this->UnlinkSrc1());
    instrBr->SetSrc2(this->UnlinkSrc2());

    this->Remove();

    return instrBr;
}